

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::TimeScaleDirectiveSyntax::setChild
          (TimeScaleDirectiveSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00c93074 + *(int *)(&DAT_00c93074 + in_RSI * 4)))();
  return;
}

Assistant:

void TimeScaleDirectiveSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: directive = child.token(); return;
        case 1: timeUnit = child.token(); return;
        case 2: slash = child.token(); return;
        case 3: timePrecision = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}